

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O0

void p_crypto_hash_gost3411_finish(PHashGOST3411 *ctx)

{
  uint uVar1;
  uint uVar2;
  puint32 last;
  puint32 left;
  PHashGOST3411 *ctx_local;
  
  uVar1 = ctx->len[0] & 0xff;
  uVar2 = 0x20 - (uVar1 >> 3);
  if ((uVar2 & 0x1f) != 0) {
    memset((void *)((long)ctx->buf + (ulong)(uVar1 >> 3)),0,(ulong)uVar2);
    pp_crypto_hash_gost3411_swap_bytes(ctx->buf,8);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
  }
  pp_crypto_hash_gost3411_process(ctx,ctx->len);
  pp_crypto_hash_gost3411_process(ctx,ctx->sum);
  pp_crypto_hash_gost3411_swap_bytes(ctx->hash,8);
  return;
}

Assistant:

void
p_crypto_hash_gost3411_finish (PHashGOST3411 *ctx)
{
	puint32	left;
	puint32	last;

	left = ctx->len[0] & 0xFF;
	last = 32 - (left >> 3);

	if (last % 32 != 0) {
		memset ((pchar *) ctx->buf + (left >> 3), 0, last);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);
	}

	pp_crypto_hash_gost3411_process (ctx, ctx->len);
	pp_crypto_hash_gost3411_process (ctx, ctx->sum);

	pp_crypto_hash_gost3411_swap_bytes (ctx->hash, 8);
}